

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sanity.cpp
# Opt level: O0

void __thiscall cubeb_drain_Test::TestBody(cubeb_drain_Test *this)

{
  bool bVar1;
  __int_type_conflict _Var2;
  char *pcVar3;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar_7;
  AssertionResult gtest_ar_6;
  AssertionResult gtest_ar_5;
  AssertionResult gtest_ar_4;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint64_t position;
  cubeb_stream_params params;
  cubeb_stream *stream;
  cubeb *ctx;
  int r;
  memory_order __b;
  cubeb_stream *stream_00;
  undefined1 success;
  undefined4 in_stack_fffffffffffffdf0;
  undefined4 uVar4;
  __int_type_conflict in_stack_fffffffffffffdf4;
  int *in_stack_fffffffffffffdf8;
  code *this_00;
  __atomic_base<unsigned_long> *in_stack_fffffffffffffe00;
  code *this_01;
  char *in_stack_fffffffffffffe08;
  int *expected_expression;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe30;
  AssertHelper in_stack_fffffffffffffe38;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe40;
  char *in_stack_fffffffffffffe48;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe50;
  AssertHelper in_stack_fffffffffffffe58;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffe60;
  AssertionResult local_190;
  AssertHelper local_180;
  Message local_178;
  cubeb_stream_params *in_stack_fffffffffffffe90;
  uint in_stack_fffffffffffffe98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffea0;
  AssertHelper in_stack_fffffffffffffea8;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  in_stack_fffffffffffffeb0;
  AssertionResult local_140;
  AssertHelper local_130;
  Message local_128;
  undefined4 local_11c;
  AssertionResult local_118;
  AssertHelper local_108;
  Message local_100;
  undefined8 local_f8;
  AssertionResult local_f0;
  AssertHelper local_e0;
  Message local_d8;
  undefined4 local_cc;
  AssertionResult local_c8;
  AssertHelper local_b8;
  Message local_b0;
  undefined8 local_a8;
  AssertionResult local_a0;
  uint local_8c;
  AssertHelper local_88;
  Message local_80;
  undefined4 local_74;
  AssertionResult local_70;
  cubeb_stream local_54;
  undefined4 local_44;
  int local_2c;
  __atomic_base<unsigned_long> local_20;
  memory_order local_18;
  undefined4 local_14;
  atomic<unsigned_long> *local_10;
  
  delay_callback = 0;
  std::__atomic_base<unsigned_long>::operator=
            (in_stack_fffffffffffffe00,(__int_type)in_stack_fffffffffffffdf8);
  local_2c = common_init((cubeb **)in_stack_fffffffffffffe00,(char *)in_stack_fffffffffffffdf8);
  local_74 = 0;
  testing::internal::EqHelper<false>::Compare<int,__0>
            (in_stack_fffffffffffffe08,(char *)in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
             (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,in_stack_fffffffffffffdf0));
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_70);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_fffffffffffffe00);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10edca);
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
               ,0x256,pcVar3);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    testing::Message::~Message((Message *)0x10ee1a);
  }
  local_8c = (uint)!bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ee3f);
  if (local_8c == 0) {
    local_a8 = 0;
    testing::internal::CmpHelperNE<cubeb*,decltype(nullptr)>
              (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40.ptr_,
               (cubeb **)in_stack_fffffffffffffe38.data_,(void **)in_stack_fffffffffffffe30.ptr_);
    bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_a0);
    if (!bVar1) {
      testing::Message::Message((Message *)in_stack_fffffffffffffe00);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10eeb7);
      testing::internal::AssertHelper::AssertHelper
                (&local_b8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                 ,599,pcVar3);
      testing::internal::AssertHelper::operator=(&local_b8,&local_b0);
      testing::internal::AssertHelper::~AssertHelper(&local_b8);
      testing::Message::~Message((Message *)0x10ef07);
    }
    local_8c = (uint)!bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)0x10ef2c);
    if (local_8c == 0) {
      local_54.context._0_4_ = 0;
      local_54.context._4_4_ = 0xac44;
      local_54.user_ptr._0_4_ = 1;
      local_54.user_ptr._4_4_ = 4;
      local_44 = 0;
      stream_00 = &local_54;
      uVar4 = 0x113a;
      this_00 = test_drain_data_callback;
      this_01 = test_drain_state_callback;
      expected_expression = &dummy;
      local_2c = cubeb_stream_init((cubeb *)in_stack_fffffffffffffe60.ptr_,
                                   (cubeb_stream **)in_stack_fffffffffffffe58.data_,
                                   (char *)in_stack_fffffffffffffe50.ptr_,in_stack_fffffffffffffe48,
                                   (cubeb_stream_params *)in_stack_fffffffffffffe40.ptr_,
                                   in_stack_fffffffffffffe38.data_,in_stack_fffffffffffffe90,
                                   in_stack_fffffffffffffe98,
                                   (cubeb_data_callback)in_stack_fffffffffffffea0.ptr_,
                                   (cubeb_state_callback)in_stack_fffffffffffffea8.data_,
                                   in_stack_fffffffffffffeb0.ptr_);
      local_cc = 0;
      testing::internal::EqHelper<false>::Compare<int,__0>
                ((char *)expected_expression,(char *)this_01,(int *)this_00,
                 (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,uVar4));
      bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_c8);
      if (!bVar1) {
        testing::Message::Message((Message *)this_01);
        pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10f040);
        testing::internal::AssertHelper::AssertHelper
                  (&local_e0,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                   ,0x261,pcVar3);
        testing::internal::AssertHelper::operator=(&local_e0,&local_d8);
        testing::internal::AssertHelper::~AssertHelper(&local_e0);
        testing::Message::~Message((Message *)0x10f090);
      }
      local_8c = (uint)!bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f0b5);
      if (local_8c == 0) {
        local_f8 = 0;
        testing::internal::CmpHelperNE<cubeb_stream*,decltype(nullptr)>
                  (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40.ptr_,
                   (cubeb_stream **)in_stack_fffffffffffffe38.data_,
                   (void **)in_stack_fffffffffffffe30.ptr_);
        bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_f0);
        if (!bVar1) {
          testing::Message::Message((Message *)this_01);
          pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10f12d);
          testing::internal::AssertHelper::AssertHelper
                    (&local_108,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                     ,0x262,pcVar3);
          testing::internal::AssertHelper::operator=(&local_108,&local_100);
          testing::internal::AssertHelper::~AssertHelper(&local_108);
          testing::Message::~Message((Message *)0x10f17d);
        }
        local_8c = (uint)!bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f1a2);
        if (local_8c == 0) {
          local_2c = cubeb_stream_start(stream_00);
          local_11c = 0;
          testing::internal::EqHelper<false>::Compare<int,__0>
                    ((char *)expected_expression,(char *)this_01,(int *)this_00,
                     (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,uVar4));
          bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_118);
          if (!bVar1) {
            testing::Message::Message((Message *)this_01);
            pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10f22d);
            testing::internal::AssertHelper::AssertHelper
                      (&local_130,kFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                       ,0x265,pcVar3);
            testing::internal::AssertHelper::operator=(&local_130,&local_128);
            testing::internal::AssertHelper::~AssertHelper(&local_130);
            testing::Message::~Message((Message *)0x10f27d);
          }
          local_8c = (uint)!bVar1;
          testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f2a2);
          if (local_8c == 0) {
            delay(0);
            std::__atomic_base<int>::operator=
                      ((__atomic_base<int> *)this_00,in_stack_fffffffffffffdf4);
            while( true ) {
              local_2c = cubeb_stream_get_position(stream_00,(uint64_t *)0x10f2e4);
              testing::internal::EqHelper<false>::Compare<int,__0>
                        ((char *)expected_expression,(char *)this_01,(int *)this_00,
                         (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,uVar4));
              bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_140);
              if (!bVar1) {
                testing::Message::Message((Message *)this_01);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10f350);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffea8,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                           ,0x26d,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffffea8,
                           (Message *)&stack0xfffffffffffffeb0);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffea8);
                testing::Message::~Message((Message *)0x10f3a0);
              }
              local_8c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f3c5);
              if (local_8c != 0) {
                return;
              }
              _Var2 = std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)this_00);
              if (_Var2 != 0) break;
              local_10 = &total_frames_written;
              local_14 = 5;
              local_18 = std::operator&(memory_order_seq_cst,__memory_order_mask);
              local_20 = total_frames_written.super___atomic_base<unsigned_long>._M_i;
              testing::internal::CmpHelperLE<unsigned_long,unsigned_long>
                        (in_stack_fffffffffffffe48,(char *)in_stack_fffffffffffffe40.ptr_,
                         (unsigned_long *)in_stack_fffffffffffffe38.data_,
                         (unsigned_long *)in_stack_fffffffffffffe30.ptr_);
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffe98);
              if (!bVar1) {
                testing::Message::Message((Message *)this_01);
                pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10f4e9);
                testing::internal::AssertHelper::AssertHelper
                          (&local_180,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                           ,0x271,pcVar3);
                testing::internal::AssertHelper::operator=(&local_180,&local_178);
                testing::internal::AssertHelper::~AssertHelper(&local_180);
                testing::Message::~Message((Message *)0x10f539);
              }
              local_8c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f55e);
              if (local_8c != 0) {
                return;
              }
              delay(0);
            }
            local_2c = cubeb_stream_get_position(stream_00,(uint64_t *)0x10f596);
            success = (undefined1)((ulong)stream_00 >> 0x38);
            testing::internal::EqHelper<false>::Compare<int,__0>
                      ((char *)expected_expression,(char *)this_01,(int *)this_00,
                       (anon_enum_32 *)CONCAT44(in_stack_fffffffffffffdf4,uVar4));
            bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_190);
            if (!bVar1) {
              testing::Message::Message((Message *)this_01);
              pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)0x10f5ff);
              testing::internal::AssertHelper::AssertHelper
                        ((AssertHelper *)&stack0xfffffffffffffe58,kFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                         ,0x277,pcVar3);
              testing::internal::AssertHelper::operator=
                        ((AssertHelper *)&stack0xfffffffffffffe58,
                         (Message *)&stack0xfffffffffffffe60);
              testing::internal::AssertHelper::~AssertHelper
                        ((AssertHelper *)&stack0xfffffffffffffe58);
              testing::Message::~Message((Message *)0x10f640);
            }
            local_8c = (uint)!bVar1;
            testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f665);
            if (local_8c == 0) {
              std::__atomic_base::operator_cast_to_int((__atomic_base<int> *)this_00);
              testing::AssertionResult::AssertionResult
                        ((AssertionResult *)CONCAT44(in_stack_fffffffffffffdf4,uVar4),(bool)success)
              ;
              bVar1 = testing::AssertionResult::operator_cast_to_bool
                                ((AssertionResult *)&stack0xfffffffffffffe48);
              if (!bVar1) {
                testing::Message::Message((Message *)this_01);
                testing::internal::GetBoolAssertionFailureMessage
                          ((AssertionResult *)&stack0xfffffffffffffe28,&stack0xfffffffffffffe48,
                           "got_drain","false");
                pcVar3 = testing::internal::String::c_str((String *)&stack0xfffffffffffffe28);
                testing::internal::AssertHelper::AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffe38,kFatalFailure,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/kinetiknz[P]cubeb/test/test_sanity.cpp"
                           ,0x278,pcVar3);
                testing::internal::AssertHelper::operator=
                          ((AssertHelper *)&stack0xfffffffffffffe38,
                           (Message *)&stack0xfffffffffffffe40);
                testing::internal::AssertHelper::~AssertHelper
                          ((AssertHelper *)&stack0xfffffffffffffe38);
                testing::internal::String::~String
                          ((String *)CONCAT44(in_stack_fffffffffffffdf4,uVar4));
                testing::Message::~Message((Message *)0x10f731);
              }
              local_8c = (uint)!bVar1;
              testing::AssertionResult::~AssertionResult((AssertionResult *)0x10f753);
              if (local_8c == 0) {
                cubeb_stream_destroy((cubeb_stream *)0x10f76f);
                cubeb_destroy((cubeb *)0x10f77c);
                std::__atomic_base<int>::operator=
                          ((__atomic_base<int> *)this_00,in_stack_fffffffffffffdf4);
                std::__atomic_base<int>::operator=
                          ((__atomic_base<int> *)this_00,in_stack_fffffffffffffdf4);
              }
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

TEST(cubeb, drain)
{
  int r;
  cubeb * ctx;
  cubeb_stream * stream;
  cubeb_stream_params params;
  uint64_t position;

  delay_callback = 0;
  total_frames_written = 0;

  r = common_init(&ctx, "test_sanity");
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(ctx, nullptr);

  params.format = STREAM_FORMAT;
  params.rate = STREAM_RATE;
  params.channels = STREAM_CHANNELS;
  params.layout = STREAM_LAYOUT;
  params.prefs = CUBEB_STREAM_PREF_NONE;

  r = cubeb_stream_init(ctx, &stream, "test", NULL, NULL, NULL, &params, STREAM_LATENCY,
                        test_drain_data_callback, test_drain_state_callback, &dummy);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_NE(stream, nullptr);

  r = cubeb_stream_start(stream);
  ASSERT_EQ(r, CUBEB_OK);

  delay(5000);

  do_drain = 1;

  for (;;) {
    r = cubeb_stream_get_position(stream, &position);
    ASSERT_EQ(r, CUBEB_OK);
    if (got_drain) {
      break;
    } else {
      ASSERT_LE(position, total_frames_written.load());
    }
    delay(500);
  }

  r = cubeb_stream_get_position(stream, &position);
  ASSERT_EQ(r, CUBEB_OK);
  ASSERT_TRUE(got_drain);

  // Really, we should be able to rely on position reaching our final written frame, but
  // for now let's make sure it doesn't continue beyond that point.
  //ASSERT_LE(position, total_frames_written.load());

  cubeb_stream_destroy(stream);
  cubeb_destroy(ctx);

  got_drain = 0;
  do_drain = 0;
}